

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t best_effort_strncat_to_utf16
                  (archive_string *as16,void *_p,size_t length,archive_string_conv *sc,
                  wchar_t bigendian)

{
  char cVar1;
  wchar_t wVar2;
  archive_string *paVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  short sVar8;
  char cVar9;
  char cVar10;
  
  paVar3 = archive_string_ensure(as16,as16->length + length * 2 + 2);
  if (paVar3 == (archive_string *)0x0) {
    wVar2 = L'\xffffffff';
  }
  else {
    pcVar6 = as16->s;
    pcVar4 = pcVar6 + as16->length;
    if (length == 0) {
      wVar2 = L'\0';
    }
    else {
      lVar5 = 0;
      sVar7 = 0;
      wVar2 = L'\0';
      do {
        sVar8 = (short)*(char *)((long)_p + sVar7);
        if (*(char *)((long)_p + sVar7) < '\0') {
          wVar2 = L'\xffffffff';
          sVar8 = -3;
        }
        cVar10 = (char)((ushort)sVar8 >> 8);
        cVar9 = cVar10;
        cVar1 = (char)sVar8;
        if ((int)sc == 0) {
          cVar9 = (char)sVar8;
          cVar1 = cVar10;
        }
        pcVar4[sVar7 * 2] = cVar9;
        pcVar4[sVar7 * 2 + 1] = cVar1;
        sVar7 = sVar7 + 1;
        lVar5 = lVar5 + -2;
      } while (length != sVar7);
      pcVar6 = as16->s;
      pcVar4 = pcVar4 + -lVar5;
    }
    as16->length = (long)pcVar4 - (long)pcVar6;
    *pcVar4 = '\0';
    as16->s[as16->length + 1] = '\0';
  }
  return wVar2;
}

Assistant:

static int
best_effort_strncat_to_utf16(struct archive_string *as16, const void *_p,
    size_t length, struct archive_string_conv *sc, int bigendian)
{
	const char *s = (const char *)_p;
	char *utf16;
	size_t remaining;
	int ret;

	(void)sc; /* UNUSED */
	/*
	 * Other case, we should do the best effort.
	 * If all character are ASCII(<0x7f), we can convert it.
	 * if not , we set a alternative character and return -1.
	 */
	ret = 0;
	remaining = length;

	if (archive_string_ensure(as16,
	    as16->length + (length + 1) * 2) == NULL)
		return (-1);

	utf16 = as16->s + as16->length;
	while (remaining--) {
		unsigned c = *s++;
		if (c > 127) {
			/* We cannot handle it. */
			c = UNICODE_R_CHAR;
			ret = -1;
		}
		if (bigendian)
			archive_be16enc(utf16, (uint16_t)c);
		else
			archive_le16enc(utf16, (uint16_t)c);
		utf16 += 2;
	}
	as16->length = utf16 - as16->s;
	as16->s[as16->length] = 0;
	as16->s[as16->length+1] = 0;
	return (ret);
}